

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O0

void __thiscall QEvdevKeyboardManager::loadKeymap(QEvdevKeyboardManager *this,QString *file)

{
  QLatin1StringView s;
  bool bVar1;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  Device *keyboard_1;
  DeviceHandlerList<QEvdevKeyboardHandler> *__range2_2;
  Device *keyboard;
  DeviceHandlerList<QEvdevKeyboardHandler> *__range2_1;
  QStringView *arg;
  QList<QStringView> *__range2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QStringView> specs;
  QString keymapFromSpec;
  undefined4 in_stack_fffffffffffffee8;
  SplitBehaviorFlags in_stack_fffffffffffffeec;
  QStringView *in_stack_fffffffffffffef0;
  QEvdevKeyboardHandler *in_stack_ffffffffffffff00;
  QStringView *in_stack_ffffffffffffff08;
  qsizetype in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  QStringView *in_stack_ffffffffffffff30;
  QEvdevKeyboardHandler *in_stack_ffffffffffffff38;
  QEvdevKeyboardHandler *this_00;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
  local_a8;
  Device *local_a0;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
  local_98;
  QStringView local_90;
  QStringView *local_68;
  const_iterator local_60;
  const_iterator local_58;
  QChar local_4a;
  undefined1 local_48 [16];
  QObject local_38;
  undefined7 uStack_37;
  undefined8 local_30;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  QFdContainer local_10;
  undefined4 uStack_c;
  QSocketNotifier *local_8;
  
  local_8 = *(QSocketNotifier **)(in_FS_OFFSET + 0x28);
  QString::operator=((QString *)&in_RDI[2].d.size,in_RSI);
  bVar1 = QString::isEmpty((QString *)0x132a38);
  if (bVar1) {
    local_20 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_18 = -0x5555555555555556;
    local_10.m_fd = -0x55555556;
    uStack_c = 0xaaaaaaaa;
    QString::QString((QString *)0x132a7b);
    local_38 = (QObject)0xaa;
    uStack_37 = 0xaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = (Data *)0xaaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>((QStringView *)in_stack_ffffffffffffff00,in_RDI);
    QChar::QChar<char16_t,_true>(&local_4a,L':');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec
              );
    QStringView::split((QChar)(char16_t)&stack0xffffffffffffffc8,(QFlags_conflict *)local_48,
                       (uint)(ushort)local_4a.ucs);
    this_00 = (QEvdevKeyboardHandler *)&stack0xffffffffffffffc8;
    local_58.i = (QStringView *)0xaaaaaaaaaaaaaaaa;
    local_58 = QList<QStringView>::begin(in_stack_fffffffffffffef0);
    local_60.i = (QStringView *)0xaaaaaaaaaaaaaaaa;
    local_60 = QList<QStringView>::end(in_stack_fffffffffffffef0);
    while( true ) {
      local_68 = local_60.i;
      bVar1 = QList<QStringView>::const_iterator::operator!=(&local_58,local_60);
      if (!bVar1) break;
      in_stack_fffffffffffffef0 = QList<QStringView>::const_iterator::operator*(&local_58);
      in_stack_ffffffffffffff30 = in_stack_fffffffffffffef0;
      Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffef0)
      ;
      s.m_data = in_stack_ffffffffffffff18;
      s.m_size = in_stack_ffffffffffffff10;
      bVar1 = QStringView::startsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),s,
                         CaseInsensitive);
      if (bVar1) {
        local_90 = QStringView::mid(in_stack_ffffffffffffff08,(qsizetype)in_stack_ffffffffffffff18,
                                    in_stack_ffffffffffffff10);
        QStringView::toString(in_stack_fffffffffffffef0);
        QString::operator=((QString *)in_stack_fffffffffffffef0,
                           (QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
        ;
        QString::~QString((QString *)0x132c5a);
      }
      QList<QStringView>::const_iterator::operator++(&local_58);
    }
    local_98._M_current = (Device *)0xaaaaaaaaaaaaaaaa;
    local_98._M_current =
         (Device *)
         QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::begin
                   ((DeviceHandlerList<QEvdevKeyboardHandler> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_a0 = (Device *)0xaaaaaaaaaaaaaaaa;
    local_a0 = (Device *)
               QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::end
                         ((DeviceHandlerList<QEvdevKeyboardHandler> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
      ::operator*(&local_98);
      bVar1 = QString::isEmpty((QString *)0x132d0d);
      if (bVar1) {
        std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::
        operator->((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *
                   )0x132d21);
        QEvdevKeyboardHandler::unloadKeymap(in_stack_ffffffffffffff00);
      }
      else {
        std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::
        operator->((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *
                   )0x132d39);
        QEvdevKeyboardHandler::loadKeymap(this_00,(QString *)in_stack_ffffffffffffff30);
      }
      __gnu_cxx::
      __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
      ::operator++(&local_98);
    }
    QList<QStringView>::~QList((QList<QStringView> *)0x132d6a);
    QString::~QString((QString *)0x132d77);
  }
  else {
    local_a8._M_current = (Device *)0xaaaaaaaaaaaaaaaa;
    local_a8._M_current =
         (Device *)
         QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::begin
                   ((DeviceHandlerList<QEvdevKeyboardHandler> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::end
              ((DeviceHandlerList<QEvdevKeyboardHandler> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
      ::operator*(&local_a8);
      std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::
      operator->((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
                 0x132e10);
      QEvdevKeyboardHandler::loadKeymap
                (in_stack_ffffffffffffff38,(QString *)in_stack_ffffffffffffff30);
      __gnu_cxx::
      __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>_>
      ::operator++(&local_a8);
    }
  }
  if (*(QSocketNotifier **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevKeyboardManager::loadKeymap(const QString &file)
{
    m_defaultKeymapFile = file;

    if (file.isEmpty()) {
        // Restore the default, which is either the built-in keymap or
        // the one given in the plugin spec.
        QString keymapFromSpec;
        const auto specs = QStringView{m_spec}.split(u':');
        for (const auto &arg : specs) {
            if (arg.startsWith("keymap="_L1))
                keymapFromSpec = arg.mid(7).toString();
        }
        for (const auto &keyboard : m_keyboards) {
            if (keymapFromSpec.isEmpty())
                keyboard.handler->unloadKeymap();
            else
                keyboard.handler->loadKeymap(keymapFromSpec);
        }
    } else {
        for (const auto &keyboard : m_keyboards)
            keyboard.handler->loadKeymap(file);
    }
}